

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O1

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseUnary(Parser *this)

{
  TokenType TVar1;
  Token *this_00;
  long *plVar2;
  Lexer *lexer;
  bool bVar3;
  mapped_type *pmVar4;
  long lVar5;
  Lexer *this_01;
  __hash_code __code;
  long *in_RSI;
  long *plVar6;
  long *plVar7;
  pointer __p;
  TokenType type;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  TokenType local_4a;
  undefined1 local_48 [32];
  unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> local_28;
  
  this_00 = *(Token **)(*in_RSI + 0xb8);
  bVar3 = Token::operator==(this_00,TOK_OP_BRACKET_OPEN);
  if (bVar3) {
    parseBrackets(this);
  }
  else {
    bVar3 = Token::operator==(this_00,TOK_OP_ARR_BRACKET_OPEN);
    if (bVar3) {
      parseArray(this);
    }
    else {
      local_4a = this_00->type;
      local_48._8_2_ = local_4a;
      pmVar4 = std::__detail::
               _Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)OPERATORS_INFO,(key_type *)(local_48 + 8));
      if ((pmVar4->
          super__Tuple_impl<0UL,_unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>).
          super__Tuple_impl<1UL,_pfederc::OperatorType,_pfederc::Associativity>.
          super__Head_base<1UL,_pfederc::OperatorType,_false>._M_head_impl == BINARY) {
        TVar1 = this_00->type;
        plVar6 = *(long **)(TOKEN_BIOP_TO_UNOP + ((ulong)TVar1 % DAT_00129390 & 0xffffffff) * 8);
        plVar7 = (long *)0x0;
        if ((plVar6 != (long *)0x0) &&
           (plVar2 = (long *)*plVar6, plVar7 = plVar6, TVar1 != *(TokenType *)((long *)*plVar6 + 1))
           ) {
          while (plVar6 = plVar2, plVar2 = (long *)*plVar6, plVar2 != (long *)0x0) {
            plVar7 = (long *)0x0;
            if (((ulong)*(TokenType *)(plVar2 + 1) % DAT_00129390 != (ulong)TVar1 % DAT_00129390) ||
               (plVar7 = plVar6, TVar1 == *(TokenType *)(plVar2 + 1))) goto LAB_0010d370;
          }
          plVar7 = (long *)0x0;
        }
LAB_0010d370:
        if (plVar7 == (long *)0x0) {
          lVar5 = 0;
        }
        else {
          lVar5 = *plVar7;
        }
        if (lVar5 == 0) {
          this->lexer = (Lexer *)0x0;
          return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
                 (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
                 this;
        }
        local_4a = *(TokenType *)(lVar5 + 10);
      }
      do {
        Lexer::next((Lexer *)*in_RSI);
        bVar3 = Token::operator==(*(Token **)(*in_RSI + 0xb8),TOK_EOL);
      } while (bVar3);
      std::__detail::
      _Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::at((_Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            *)OPERATORS_INFO,&local_4a);
      parseExpression((Parser *)local_48,(Precedence)in_RSI);
      if ((Lexer *)local_48._0_8_ == (Lexer *)0x0) {
        this->lexer = (Lexer *)0x0;
      }
      else {
        lexer = (Lexer *)*in_RSI;
        Position::operator+((Position *)(local_48 + 8),&this_00->pos,
                            (Position *)(local_48._0_8_ + 0x20));
        this_01 = (Lexer *)operator_new(0x48);
        UnOpExpr::UnOpExpr((UnOpExpr *)this_01,lexer,(Position *)(local_48 + 8),this_00,
                           (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                           local_48);
        local_28._M_t.
        super___uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::UnOpExpr_*,_std::default_delete<pfederc::UnOpExpr>_>.
        super__Head_base<0UL,_pfederc::UnOpExpr_*,_false>._M_head_impl =
             (__uniq_ptr_data<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>,_true,_true>
             )(__uniq_ptr_impl<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>)0x0;
        this->lexer = this_01;
        std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
                  (&local_28);
      }
      if ((_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_48._0_8_ !=
          (Expr *)0x0) {
        (**(code **)(*(long *)local_48._0_8_ + 8))();
      }
    }
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseUnary() noexcept {
  const Token *tok = lexer.getCurrentToken();
  if (*tok == TokenType::TOK_OP_BRACKET_OPEN)
    return parseBrackets();
  else if (*tok == TokenType::TOK_OP_ARR_BRACKET_OPEN)
    return parseArray();

  
  TokenType type = tok->getType();
  if (std::get<1>(OPERATORS_INFO.at(tok->getType())) == OperatorType::BINARY) {
    auto bioptounop = TOKEN_BIOP_TO_UNOP.find(tok->getType());
    if (bioptounop == TOKEN_BIOP_TO_UNOP.end())
      return nullptr;

    type = std::get<1>(*bioptounop);
  }

  lexer.next(); // eat unary operator
  // ignore newline tekons
  while (*lexer.getCurrentToken() == TokenType::TOK_EOL)
    lexer.next();

  const Precedence prec = std::get<0>(OPERATORS_INFO.at(type));
  std::unique_ptr<Expr> expr = parseExpression(prec);
  if (!expr)
    return nullptr;

  return std::make_unique<UnOpExpr>(lexer,
    tok->getPosition() + expr->getPosition(), tok, std::move(expr));
}